

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O3

Optional<llvm::DWARFFormValue> * __thiscall
llvm::DWARFDie::find
          (Optional<llvm::DWARFFormValue> *__return_storage_ptr__,DWARFDie *this,
          ArrayRef<llvm::dwarf::Attribute> Attrs)

{
  Attribute Attr;
  DWARFAbbreviationDeclaration *this_00;
  uint64_t DIEOffset;
  long lVar1;
  
  if ((((this->U != (DWARFUnit *)0x0) && (this->Die != (DWARFDebugInfoEntry *)0x0)) &&
      (this_00 = getAbbreviationDeclarationPtr(this), this_00 != (DWARFAbbreviationDeclaration *)0x0
      )) && (Attrs.Length != 0)) {
    lVar1 = 0;
    do {
      Attr = *(Attribute *)((long)Attrs.Data + lVar1);
      DIEOffset = getOffset(this);
      DWARFAbbreviationDeclaration::getAttributeValue
                (__return_storage_ptr__,this_00,DIEOffset,Attr,this->U);
      if ((__return_storage_ptr__->Storage).hasVal != false) {
        return __return_storage_ptr__;
      }
      lVar1 = lVar1 + 2;
    } while (Attrs.Length * 2 != lVar1);
  }
  (__return_storage_ptr__->Storage).field_0.empty = '\0';
  (__return_storage_ptr__->Storage).hasVal = false;
  return __return_storage_ptr__;
}

Assistant:

Optional<DWARFFormValue>
DWARFDie::find(ArrayRef<dwarf::Attribute> Attrs) const {
  if (!isValid())
    return None;
  auto AbbrevDecl = getAbbreviationDeclarationPtr();
  if (AbbrevDecl) {
    for (auto Attr : Attrs) {
      if (auto Value = AbbrevDecl->getAttributeValue(getOffset(), Attr, *U))
        return Value;
    }
  }
  return None;
}